

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  cmInstallGenerator *pcVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  reference ppcVar5;
  reference ppcVar6;
  cmMakefile *this_00;
  reference ppcVar7;
  __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
  local_80;
  __normal_iterator<cmInstallGenerator_**,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
  local_78;
  __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
  local_70;
  const_iterator git;
  vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *gens;
  cmMakefile *mf;
  __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_50;
  iterator it;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> autogenTargets;
  cmGlobalGenerator *this_local;
  
  autogenTargets.
  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->FilesReplacedDuringGenerate);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->CMP0042WarnTargets);
  uVar3 = (*this->_vptr_cmGlobalGenerator[0x22])();
  if ((uVar3 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    FinalizeTargetCompileInfo(this);
    CreateGenerationObjects(this,AllTargets);
    FillProjectMap(this);
    CreateQtAutoGeneratorsTargets
              ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               local_30,this);
    local_34 = 0;
    while( true ) {
      sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators);
      if (sVar4 <= local_34) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_34);
      (*(*ppcVar5)->_vptr_cmLocalGenerator[4])();
      local_34 = local_34 + 1;
    }
    local_50._M_current =
         (cmGeneratorTarget **)
         std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                   ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *
                    )local_30);
    while( true ) {
      mf = (cmMakefile *)
           std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::end
                     ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                       *)local_30);
      bVar2 = __gnu_cxx::operator!=
                        (&local_50,
                         (__normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                          *)&mf);
      if (!bVar2) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_50);
      cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*ppcVar6);
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_**,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&local_50);
    }
    local_34 = 0;
    while( true ) {
      sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators);
      if (sVar4 <= local_34) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_34);
      this_00 = cmLocalGenerator::GetMakefile(*ppcVar5);
      git._M_current = (cmInstallGenerator **)cmMakefile::GetInstallGenerators(this_00);
      local_78._M_current =
           (cmInstallGenerator **)
           std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::begin
                     ((vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_> *)
                      git._M_current);
      __gnu_cxx::
      __normal_iterator<cmInstallGenerator*const*,std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
      ::__normal_iterator<cmInstallGenerator**>
                ((__normal_iterator<cmInstallGenerator*const*,std::vector<cmInstallGenerator*,std::allocator<cmInstallGenerator*>>>
                  *)&local_70,&local_78);
      while( true ) {
        local_80._M_current =
             (cmInstallGenerator **)
             std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>::end
                       (git._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_70,&local_80);
        if (!bVar2) break;
        ppcVar7 = __gnu_cxx::
                  __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
                  ::operator*(&local_70);
        pcVar1 = *ppcVar7;
        ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)local_34);
        (*(pcVar1->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])(pcVar1,*ppcVar5);
        __gnu_cxx::
        __normal_iterator<cmInstallGenerator_*const_*,_std::vector<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>_>
        ::operator++(&local_70);
      }
      local_34 = local_34 + 1;
    }
    (*this->_vptr_cmGlobalGenerator[9])();
    local_34 = 0;
    while( true ) {
      sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators);
      if (sVar4 <= local_34) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_34);
      cmLocalGenerator::TraceDependencies(*ppcVar5);
      local_34 = local_34 + 1;
    }
    (*this->_vptr_cmGlobalGenerator[0x25])();
    local_34 = 0;
    while( true ) {
      sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                        (&this->LocalGenerators);
      if (sVar4 <= local_34) break;
      ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,(ulong)local_34);
      cmLocalGenerator::ComputeTargetManifest(*ppcVar5);
      local_34 = local_34 + 1;
    }
    uVar3 = (*this->_vptr_cmGlobalGenerator[0x21])();
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      local_34 = 0;
      while( true ) {
        sVar4 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                          (&this->LocalGenerators);
        if (sVar4 <= local_34) break;
        ppcVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            (&this->LocalGenerators,(ulong)local_34);
        (*(*ppcVar5)->_vptr_cmLocalGenerator[3])();
        local_34 = local_34 + 1;
      }
      this_local._7_1_ = true;
    }
    std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::~vector
              ((vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *)
               local_30);
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if(!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS())
    {
    return false;
    }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  std::vector<cmGeneratorTarget const*> autogenTargets =
      this->CreateQtAutoGeneratorsTargets();
#endif

  unsigned int i;

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->AddHelperCommands();
    }

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (std::vector<cmGeneratorTarget const*>::iterator it =
       autogenTargets.begin(); it != autogenTargets.end(); ++it)
    {
    cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*it);
    }
#endif

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    std::vector<cmInstallGenerator*>& gens = mf->GetInstallGenerators();
    for (std::vector<cmInstallGenerator*>::const_iterator git = gens.begin();
         git != gens.end(); ++git)
      {
      (*git)->Compute(this->LocalGenerators[i]);
      }
    }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->TraceDependencies();
    }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeTargetManifest();
    }

  // Compute the inter-target dependencies.
  if(!this->ComputeTargetDepends())
    {
    return false;
    }

  for (i = 0; i < this->LocalGenerators.size(); ++i)
    {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
    }

  return true;
}